

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O3

input_buffer * __thiscall
dtc::input_buffer::buffer_from_offset
          (input_buffer *__return_storage_ptr__,input_buffer *this,int offset,int s)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  
  if (-1 < offset) {
    iVar1 = this->size;
    iVar3 = iVar1 - offset;
    if (s != 0) {
      iVar3 = s;
    }
    if ((offset <= iVar1) && (iVar3 <= iVar1 - offset)) {
      pcVar2 = this->buffer;
      __return_storage_ptr__->_vptr_input_buffer = (_func_int **)&PTR_filename_abi_cxx11__00148260;
      __return_storage_ptr__->buffer = pcVar2 + (uint)offset;
      __return_storage_ptr__->size = iVar3;
      __return_storage_ptr__->cursor = 0;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->_vptr_input_buffer = (_func_int **)&PTR_filename_abi_cxx11__00148260;
  __return_storage_ptr__->buffer = (char *)0x0;
  __return_storage_ptr__->size = 0;
  __return_storage_ptr__->cursor = 0;
  return __return_storage_ptr__;
}

Assistant:

input_buffer
input_buffer::buffer_from_offset(int offset, int s)
{
	if (offset < 0)
	{
		return input_buffer();
	}
	if (s == 0)
	{
		s = size - offset;
	}
	if (offset > size)
	{
		return input_buffer();
	}
	if (s > (size-offset))
	{
		return input_buffer();
	}
	return input_buffer(&buffer[offset], s);
}